

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void freeIndex(sqlite3 *db,Index *p)

{
  if (p->pPartIdxWhere != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,p->pPartIdxWhere);
  }
  if (p->aColExpr != (ExprList *)0x0) {
    exprListDeleteNN(db,p->aColExpr);
  }
  if (p->zColAff != (char *)0x0) {
    sqlite3DbFreeNN(db,p->zColAff);
  }
  if (((p->field_0x63 & 0x10) != 0) && (p->azColl != (char **)0x0)) {
    sqlite3DbFreeNN(db,p->azColl);
  }
  if (p != (Index *)0x0) {
    sqlite3DbFreeNN(db,p);
    return;
  }
  return;
}

Assistant:

static void freeIndex(sqlite3 *db, Index *p){
#ifndef SQLITE_OMIT_ANALYZE
  sqlite3DeleteIndexSamples(db, p);
#endif
  sqlite3ExprDelete(db, p->pPartIdxWhere);
  sqlite3ExprListDelete(db, p->aColExpr);
  sqlite3DbFree(db, p->zColAff);
  if( p->isResized ) sqlite3DbFree(db, (void *)p->azColl);
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  sqlite3_free(p->aiRowEst);
#endif
  sqlite3DbFree(db, p);
}